

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

void __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>>::Archive
          (FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>> *this)

{
  MemIOWriter *in_RSI;
  
  FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>::Archive
            ((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_> *)(this + -0x38),in_RSI);
  return;
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }